

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O1

void ask_user_lpar(NaStdBackPropParams *lpar)

{
  NaReal NVar1;
  
  NVar1 = ask_user_real("Learning rate (hidden layers)",lpar->eta);
  lpar->eta = NVar1;
  NVar1 = ask_user_real("Learning rate (output layer)",lpar->eta_output);
  lpar->eta_output = NVar1;
  NVar1 = ask_user_real("Momentum (inertia)",lpar->alpha);
  lpar->alpha = NVar1;
  NaPrintLog("Learning parameters: lrate=%g  lrate(out)=%g  momentum=%g\n",lpar->eta,
             lpar->eta_output,SUB84(NVar1,0));
  return;
}

Assistant:

void
ask_user_lpar (NaStdBackPropParams& lpar)
{
    lpar.eta = ask_user_real("Learning rate (hidden layers)", lpar.eta);
    lpar.eta_output = ask_user_real("Learning rate (output layer)",
                               lpar.eta_output);
    lpar.alpha = ask_user_real("Momentum (inertia)", lpar.alpha);

    NaPrintLog("Learning parameters: lrate=%g  lrate(out)=%g  momentum=%g\n",
                lpar.eta, lpar.eta_output, lpar.alpha);
}